

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest01SignatureVerification_::
Section1ValidDSAParameterInheritanceTest5<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section1ValidDSAParameterInheritanceTest5
          (Section1ValidDSAParameterInheritanceTest5<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest01SignatureVerification,
                     Section1ValidDSAParameterInheritanceTest5) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "DSACACert",
                               "DSAParametersInheritedCACert",
                               "ValidDSAParameterInheritanceTest5EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "DSACACRL",
                              "DSAParametersInheritedCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.1.5";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}